

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  uint uVar1;
  int iVar2;
  Parse sParse;
  
  uVar1 = sqlite3FindDbName(pDb,zDb);
  if (uVar1 == 1) {
    sqlite3ParseObjectInit(&sParse,pDb);
    iVar2 = sqlite3OpenTempDatabase(&sParse);
    if (iVar2 != 0) {
      sqlite3ErrorWithMsg(pErrorDb,sParse.rc,"%s",sParse.zErrMsg);
      sqlite3DbFree(pErrorDb,sParse.zErrMsg);
      sqlite3ParseObjectReset(&sParse);
      return (Btree *)0x0;
    }
    sqlite3DbFree(pErrorDb,sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
  }
  else if ((int)uVar1 < 0) {
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
    return (Btree *)0x0;
  }
  return pDb->aDb[uVar1].pBt;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    sqlite3ParseObjectInit(&sParse,pDb);
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}